

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApprovalTestNamer.cpp
# Opt level: O2

string * ApprovalTests::TestName::checkParentDirectoriesForFile
                   (string *__return_storage_ptr__,string *file)

{
  bool bVar1;
  int iVar2;
  string prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> newFileName;
  string backOne;
  
  ::std::operator+(&newFileName,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   directoryPrefix_abi_cxx11_,file);
  bVar1 = FileUtils::fileExists(&newFileName);
  if (!bVar1) {
    SystemUtils::getDirectorySeparator_abi_cxx11_();
    ::std::operator+(&backOne,"..",&prefix);
    ::std::__cxx11::string::~string((string *)&prefix);
    prefix._M_dataplus._M_p = (pointer)&prefix.field_2;
    prefix._M_string_length = 0;
    prefix.field_2._M_local_buf[0] = '\0';
    iVar2 = 10;
    while (bVar1 = iVar2 != 0, iVar2 = iVar2 + -1, bVar1) {
      ::std::__cxx11::string::append((string *)&prefix);
      ::std::operator+(__return_storage_ptr__,&prefix,file);
      bVar1 = FileUtils::fileExists(__return_storage_ptr__);
      if (bVar1) {
        ::std::__cxx11::string::_M_assign((string *)directoryPrefix_abi_cxx11_);
        ::std::__cxx11::string::~string((string *)&prefix);
        ::std::__cxx11::string::~string((string *)&backOne);
        goto LAB_0010cf18;
      }
      ::std::__cxx11::string::~string((string *)__return_storage_ptr__);
    }
    ::std::__cxx11::string::~string((string *)&prefix);
    ::std::__cxx11::string::~string((string *)&backOne);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)newFileName._M_dataplus._M_p == &newFileName.field_2) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(newFileName.field_2._M_allocated_capacity._1_7_,
                  newFileName.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = newFileName.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = newFileName._M_dataplus._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(newFileName.field_2._M_allocated_capacity._1_7_,
                  newFileName.field_2._M_local_buf[0]);
  }
  __return_storage_ptr__->_M_string_length = newFileName._M_string_length;
  newFileName._M_string_length = 0;
  newFileName.field_2._M_local_buf[0] = '\0';
  newFileName._M_dataplus._M_p = (pointer)&newFileName.field_2;
LAB_0010cf18:
  ::std::__cxx11::string::~string((string *)&newFileName);
  return __return_storage_ptr__;
}

Assistant:

std::string TestName::checkParentDirectoriesForFile(const std::string& file)
    {
        auto newFileName = directoryPrefix + file;

        if (!FileUtils::fileExists(newFileName))
        {
            // If the build system is Ninja, try looking several levels higher...
            std::string backOne = ".." + SystemUtils::getDirectorySeparator();
            std::string prefix;
            for (int i = 0; i != 10; i++)
            {
                prefix += backOne;
                auto candidateName = prefix + file;
                if (FileUtils::fileExists(candidateName))
                {
                    directoryPrefix = prefix;
                    return candidateName;
                }
            }
        }
        return newFileName;
    }